

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obuf.c
# Opt level: O2

void obuf_rollback_to_svp(obuf *buf,obuf_svp *svp)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  long lVar4;
  size_t *psVar5;
  
  iVar1 = buf->pos;
  if (svp->pos <= (ulong)(long)iVar1) {
    sVar2 = buf->iov[iVar1].iov_len;
    iVar3 = (int)svp->pos;
    buf->pos = iVar3;
    lVar4 = (long)iVar3;
    buf->iov[lVar4].iov_len = svp->iov_len;
    buf->used = svp->used;
    psVar5 = &buf->iov[lVar4 + 1].iov_len;
    while (lVar4 = lVar4 + 1, lVar4 < (int)((iVar1 + 1) - (uint)(sVar2 == 0))) {
      *psVar5 = 0;
      psVar5 = psVar5 + 2;
    }
    buf->reserved = false;
    return;
  }
  __assert_fail("svp->pos <= (size_t)buf->pos",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/obuf.c",
                0xd5,"void obuf_rollback_to_svp(struct obuf *, struct obuf_svp *)");
}

Assistant:

void
obuf_rollback_to_svp(struct obuf *buf, struct obuf_svp *svp)
{
	assert(svp->pos <= (size_t)buf->pos);
	int iovcnt = obuf_iovcnt(buf);

	buf->pos = svp->pos;
	buf->iov[buf->pos].iov_len = svp->iov_len;
	buf->used = svp->used;
	int i;
	for (i = buf->pos + 1; i < iovcnt; i++)
		buf->iov[i].iov_len = 0;
#ifndef NDEBUG
	buf->reserved = false;
#endif
}